

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

DBKeyID __thiscall
anon_unknown.dwarf_3965cd::SQLiteBuildDB::getKeyID
          (SQLiteBuildDB *this,KeyID keyID,string *error_out)

{
  bool bVar1;
  pointer pvVar2;
  KeyID *pKVar3;
  DBKeyID *pDVar4;
  iterator local_58;
  ConstIterator local_48;
  undefined1 local_38 [8];
  iterator it;
  string *error_out_local;
  SQLiteBuildDB *this_local;
  KeyID keyID_local;
  DBKeyID dbKeyID;
  
  it.End = (pointer)error_out;
  this_local = (SQLiteBuildDB *)keyID._value;
  _local_38 = llvm::
              DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
              ::find((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                      *)&this->dbKeyIDs,(const_arg_type_t<llbuild::core::KeyID>)&this_local);
  local_58 = llvm::
             DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
             ::end((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                    *)&this->dbKeyIDs);
  llvm::
  DenseMapIterator<llbuild::core::KeyID,DBKeyID,llvm::DenseMapInfo<llbuild::core::KeyID>,llvm::detail::DenseMapPair<llbuild::core::KeyID,DBKeyID>,true>
  ::DenseMapIterator<false,void>
            ((DenseMapIterator<llbuild::core::KeyID,DBKeyID,llvm::DenseMapInfo<llbuild::core::KeyID>,llvm::detail::DenseMapPair<llbuild::core::KeyID,DBKeyID>,true>
              *)&local_48,&local_58);
  bVar1 = llvm::
          DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
          ::operator!=((DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
                        *)local_38,&local_48);
  if (bVar1) {
    pvVar2 = llvm::
             DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
             ::operator->((DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
                           *)local_38);
    keyID_local._value = (pvVar2->super_pair<llbuild::core::KeyID,_DBKeyID>).second.value;
  }
  else {
    keyID_local._value = (ValueTy)getKeyIDFromDB(this,(KeyID)this_local,(string *)it.End);
    if (keyID_local._value != 0) {
      pKVar3 = llvm::
               DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
               ::operator[]((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                             *)&this->engineKeyIDs,(DBKeyID *)&keyID_local);
      pKVar3->_value = (ValueTy)this_local;
      pDVar4 = llvm::
               DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
               ::operator[]((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                             *)&this->dbKeyIDs,(KeyID *)&this_local);
      pDVar4->value = keyID_local._value;
    }
  }
  return (DBKeyID)keyID_local._value;
}

Assistant:

DBKeyID getKeyID(KeyID keyID, std::string *error_out) {
    // Try to fetch the DBKeyID from the cache
    auto it = dbKeyIDs.find(keyID);
    if (it != dbKeyIDs.end()) {
      return it->second;
    }

    auto dbKeyID = getKeyIDFromDB(keyID, error_out);

    if (dbKeyID.value != 0) {
      // Cache the ID mappings
      engineKeyIDs[dbKeyID] = keyID;
      dbKeyIDs[keyID] = dbKeyID;
    }

    return dbKeyID;
  }